

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O2

void my_canvas_size(t_my_canvas *x,t_symbol *s,int ac,t_atom *av)

{
  int iVar1;
  t_float tVar2;
  
  tVar2 = atom_getfloatarg(0,ac,av);
  iVar1 = 1;
  if (1 < (int)tVar2) {
    iVar1 = (int)tVar2;
  }
  iVar1 = iVar1 * ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_w = iVar1;
  (x->x_gui).x_h = iVar1;
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void my_canvas_size(t_my_canvas *x, t_symbol *s, int ac, t_atom *av)
{
    int i = atom_getfloatarg(0, ac, av);

    if(i < 1)
        i = 1;
    x->x_gui.x_w = i*IEMGUI_ZOOM(x);
    x->x_gui.x_h = x->x_gui.x_w;
    iemgui_size((void *)x, &x->x_gui);
}